

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O2

void cftmdl2(int n,double *a,double *w)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  long lVar13;
  double *pdVar14;
  long lVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  
  iVar6 = n >> 3;
  dVar21 = w[1];
  iVar9 = iVar6 * 6;
  iVar1 = iVar6 * 4 + 1;
  dVar19 = *a - a[iVar1];
  lVar13 = (long)(iVar6 * 4);
  dVar22 = a[1] + a[lVar13];
  dVar18 = *a + a[iVar1];
  dVar17 = a[1] - a[lVar13];
  lVar3 = (long)(iVar6 * 2);
  dVar26 = a[lVar3] - a[iVar9 + 1];
  iVar2 = iVar6 * 2 + 1;
  dVar32 = a[iVar2] + a[iVar9];
  dVar23 = a[lVar3] + a[iVar9 + 1];
  dVar20 = a[iVar2] - a[iVar9];
  dVar24 = (dVar26 - dVar32) * dVar21;
  dVar26 = (dVar32 + dVar26) * dVar21;
  *a = dVar19 + dVar24;
  a[1] = dVar22 + dVar26;
  a[lVar3] = dVar19 - dVar24;
  a[iVar2] = dVar22 - dVar26;
  dVar19 = (dVar23 - dVar20) * dVar21;
  dVar21 = (dVar20 + dVar23) * dVar21;
  a[lVar13] = dVar18 - dVar21;
  a[iVar1] = dVar17 + dVar19;
  a[iVar9] = dVar21 + dVar18;
  a[iVar9 + 1] = dVar17 - dVar19;
  lVar4 = (long)iVar6;
  lVar8 = lVar3 * 0x18;
  lVar11 = lVar3 << 4;
  lVar16 = lVar3 << 5;
  pdVar12 = w + 7;
  pdVar14 = w + lVar13 + -1;
  lVar5 = 2;
  lVar13 = lVar11;
  lVar7 = lVar3;
  lVar10 = lVar8;
  lVar15 = lVar3;
  while( true ) {
    lVar15 = lVar15 + -2;
    lVar10 = lVar10 + 0x10;
    lVar7 = lVar7 + 2;
    lVar13 = lVar13 + 0x10;
    lVar16 = lVar16 + -0x10;
    lVar11 = lVar11 + -0x10;
    lVar8 = lVar8 + -0x10;
    if (lVar4 <= lVar5) break;
    dVar21 = pdVar12[-3];
    dVar17 = pdVar12[-2];
    dVar18 = pdVar12[-1];
    dVar19 = *pdVar12;
    dVar20 = pdVar14[-3];
    dVar22 = pdVar14[-2];
    dVar23 = pdVar14[-1];
    dVar24 = a[lVar5];
    dVar26 = (a + lVar5)[1];
    dVar32 = *(double *)((long)a + lVar13);
    dVar25 = ((double *)((long)a + lVar13))[1];
    dVar29 = dVar24 + dVar25;
    dVar30 = dVar26 + dVar32;
    dVar24 = dVar24 - dVar25;
    dVar26 = dVar26 - dVar32;
    dVar32 = a[lVar7];
    dVar25 = (a + lVar7)[1];
    dVar33 = *(double *)((long)a + lVar10);
    dVar34 = ((double *)((long)a + lVar10))[1];
    dVar27 = dVar32 + dVar34;
    dVar28 = dVar25 + dVar33;
    dVar32 = dVar32 - dVar34;
    dVar25 = dVar25 - dVar33;
    dVar34 = dVar21 * dVar24 + -dVar17 * dVar30;
    dVar30 = dVar21 * dVar30 + dVar17 * dVar24;
    dVar24 = *pdVar14;
    dVar33 = dVar22 * dVar32 + -dVar20 * dVar28;
    dVar32 = dVar22 * dVar28 + dVar20 * dVar32;
    a[lVar5] = dVar34 + dVar33;
    (a + lVar5)[1] = dVar30 + dVar32;
    a[lVar7] = dVar34 - dVar33;
    (a + lVar7)[1] = dVar30 - dVar32;
    dVar33 = dVar18 * dVar29 + dVar26 * dVar19;
    dVar34 = dVar18 * dVar26 + dVar29 * -dVar19;
    dVar26 = dVar24 * dVar27 + dVar25 * dVar23;
    dVar32 = dVar24 * dVar25 + dVar27 * -dVar23;
    *(double *)((long)a + lVar13) = dVar33 + dVar26;
    ((double *)((long)a + lVar13))[1] = dVar34 + dVar32;
    *(double *)((long)a + lVar10) = dVar33 - dVar26;
    ((double *)((long)a + lVar10))[1] = dVar34 - dVar32;
    dVar26 = a[lVar15];
    dVar32 = (a + lVar15)[1];
    dVar25 = *(double *)((long)a + lVar8);
    dVar33 = ((double *)((long)a + lVar8))[1];
    dVar30 = dVar26 + dVar33;
    dVar31 = dVar32 + dVar25;
    dVar26 = dVar26 - dVar33;
    dVar32 = dVar32 - dVar25;
    dVar25 = *(double *)((long)a + lVar11);
    dVar33 = ((double *)((long)a + lVar11))[1];
    dVar34 = *(double *)((long)a + lVar16);
    dVar27 = ((double *)((long)a + lVar16))[1];
    dVar28 = dVar25 + dVar27;
    dVar29 = dVar33 + dVar34;
    dVar25 = dVar25 - dVar27;
    dVar33 = dVar33 - dVar34;
    dVar34 = dVar20 * dVar26 + -dVar22 * dVar31;
    dVar22 = dVar20 * dVar31 + dVar22 * dVar26;
    dVar20 = dVar17 * dVar25 + -dVar21 * dVar29;
    dVar21 = dVar17 * dVar29 + dVar21 * dVar25;
    a[lVar15] = dVar34 + dVar20;
    (a + lVar15)[1] = dVar22 + dVar21;
    *(double *)((long)a + lVar11) = dVar34 - dVar20;
    ((double *)((long)a + lVar11))[1] = dVar22 - dVar21;
    dVar20 = dVar23 * dVar30 + dVar32 * dVar24;
    dVar22 = dVar23 * dVar32 + dVar30 * -dVar24;
    dVar21 = dVar19 * dVar28 + dVar33 * dVar18;
    dVar17 = dVar19 * dVar33 + dVar28 * -dVar18;
    *(double *)((long)a + lVar8) = dVar20 + dVar21;
    ((double *)((long)a + lVar8))[1] = dVar22 + dVar17;
    *(double *)((long)a + lVar16) = dVar20 - dVar21;
    ((double *)((long)a + lVar16))[1] = dVar22 - dVar17;
    lVar5 = lVar5 + 2;
    pdVar12 = pdVar12 + 4;
    pdVar14 = pdVar14 + -4;
  }
  dVar21 = w[iVar2];
  dVar17 = w[lVar3];
  dVar18 = a[lVar4];
  dVar19 = (a + lVar4)[1];
  dVar20 = a[iVar6 * 5];
  dVar22 = (a + iVar6 * 5)[1];
  dVar26 = dVar18 + dVar22;
  dVar32 = dVar19 + dVar20;
  dVar18 = dVar18 - dVar22;
  dVar19 = dVar19 - dVar20;
  dVar20 = a[iVar6 * 3];
  dVar22 = (a + iVar6 * 3)[1];
  dVar23 = a[iVar6 * 7];
  dVar24 = (a + iVar6 * 7)[1];
  dVar25 = dVar20 + dVar24;
  dVar33 = dVar22 + dVar23;
  dVar20 = dVar20 - dVar24;
  dVar22 = dVar22 - dVar23;
  dVar23 = dVar18 * dVar17 + dVar32 * -dVar21;
  dVar18 = dVar32 * dVar17 + dVar18 * dVar21;
  dVar24 = dVar20 * dVar21 + dVar33 * -dVar17;
  dVar20 = dVar33 * dVar21 + dVar20 * dVar17;
  a[lVar4] = dVar23 + dVar24;
  (a + lVar4)[1] = dVar18 + dVar20;
  a[iVar6 * 3] = dVar23 - dVar24;
  (a + iVar6 * 3)[1] = dVar18 - dVar20;
  dVar18 = dVar21 * dVar26 + dVar19 * -dVar17;
  dVar19 = dVar21 * dVar19 + dVar26 * dVar17;
  dVar20 = dVar17 * dVar25 + dVar22 * -dVar21;
  dVar21 = dVar17 * dVar22 + dVar25 * dVar21;
  a[iVar6 * 5] = dVar18 - dVar20;
  (a + iVar6 * 5)[1] = dVar19 - dVar21;
  a[iVar6 * 7] = dVar20 + dVar18;
  (a + iVar6 * 7)[1] = dVar21 + dVar19;
  return;
}

Assistant:

void cftmdl2(int n, double *a, double *w) {
  int j, j0, j1, j2, j3, k, kr, m, mh;
  double wn4r, wk1r, wk1i, wk3r, wk3i, wd1r, wd1i, wd3r, wd3i;
  double x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i, y0r, y0i, y2r, y2i;

  mh = n >> 3;
  m = 2 * mh;
  wn4r = w[1];
  j1 = m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[0] - a[j2 + 1];
  x0i = a[1] + a[j2];
  x1r = a[0] + a[j2 + 1];
  x1i = a[1] - a[j2];
  x2r = a[j1] - a[j3 + 1];
  x2i = a[j1 + 1] + a[j3];
  x3r = a[j1] + a[j3 + 1];
  x3i = a[j1 + 1] - a[j3];
  y0r = wn4r * (x2r - x2i);
  y0i = wn4r * (x2i + x2r);
  a[0] = x0r + y0r;
  a[1] = x0i + y0i;
  a[j1] = x0r - y0r;
  a[j1 + 1] = x0i - y0i;
  y0r = wn4r * (x3r - x3i);
  y0i = wn4r * (x3i + x3r);
  a[j2] = x1r - y0i;
  a[j2 + 1] = x1i + y0r;
  a[j3] = x1r + y0i;
  a[j3 + 1] = x1i - y0r;
  k = 0;
  kr = 2 * m;
  for (j = 2; j < mh; j += 2) {
    k += 4;
    wk1r = w[k];
    wk1i = w[k + 1];
    wk3r = w[k + 2];
    wk3i = w[k + 3];
    kr -= 4;
    wd1i = w[kr];
    wd1r = w[kr + 1];
    wd3i = w[kr + 2];
    wd3r = w[kr + 3];
    j1 = j + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j] - a[j2 + 1];
    x0i = a[j + 1] + a[j2];
    x1r = a[j] + a[j2 + 1];
    x1i = a[j + 1] - a[j2];
    x2r = a[j1] - a[j3 + 1];
    x2i = a[j1 + 1] + a[j3];
    x3r = a[j1] + a[j3 + 1];
    x3i = a[j1 + 1] - a[j3];
    y0r = wk1r * x0r - wk1i * x0i;
    y0i = wk1r * x0i + wk1i * x0r;
    y2r = wd1r * x2r - wd1i * x2i;
    y2i = wd1r * x2i + wd1i * x2r;
    a[j] = y0r + y2r;
    a[j + 1] = y0i + y2i;
    a[j1] = y0r - y2r;
    a[j1 + 1] = y0i - y2i;
    y0r = wk3r * x1r + wk3i * x1i;
    y0i = wk3r * x1i - wk3i * x1r;
    y2r = wd3r * x3r + wd3i * x3i;
    y2i = wd3r * x3i - wd3i * x3r;
    a[j2] = y0r + y2r;
    a[j2 + 1] = y0i + y2i;
    a[j3] = y0r - y2r;
    a[j3 + 1] = y0i - y2i;
    j0 = m - j;
    j1 = j0 + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j0] - a[j2 + 1];
    x0i = a[j0 + 1] + a[j2];
    x1r = a[j0] + a[j2 + 1];
    x1i = a[j0 + 1] - a[j2];
    x2r = a[j1] - a[j3 + 1];
    x2i = a[j1 + 1] + a[j3];
    x3r = a[j1] + a[j3 + 1];
    x3i = a[j1 + 1] - a[j3];
    y0r = wd1i * x0r - wd1r * x0i;
    y0i = wd1i * x0i + wd1r * x0r;
    y2r = wk1i * x2r - wk1r * x2i;
    y2i = wk1i * x2i + wk1r * x2r;
    a[j0] = y0r + y2r;
    a[j0 + 1] = y0i + y2i;
    a[j1] = y0r - y2r;
    a[j1 + 1] = y0i - y2i;
    y0r = wd3i * x1r + wd3r * x1i;
    y0i = wd3i * x1i - wd3r * x1r;
    y2r = wk3i * x3r + wk3r * x3i;
    y2i = wk3i * x3i - wk3r * x3r;
    a[j2] = y0r + y2r;
    a[j2 + 1] = y0i + y2i;
    a[j3] = y0r - y2r;
    a[j3 + 1] = y0i - y2i;
  }
  wk1r = w[m];
  wk1i = w[m + 1];
  j0 = mh;
  j1 = j0 + m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[j0] - a[j2 + 1];
  x0i = a[j0 + 1] + a[j2];
  x1r = a[j0] + a[j2 + 1];
  x1i = a[j0 + 1] - a[j2];
  x2r = a[j1] - a[j3 + 1];
  x2i = a[j1 + 1] + a[j3];
  x3r = a[j1] + a[j3 + 1];
  x3i = a[j1 + 1] - a[j3];
  y0r = wk1r * x0r - wk1i * x0i;
  y0i = wk1r * x0i + wk1i * x0r;
  y2r = wk1i * x2r - wk1r * x2i;
  y2i = wk1i * x2i + wk1r * x2r;
  a[j0] = y0r + y2r;
  a[j0 + 1] = y0i + y2i;
  a[j1] = y0r - y2r;
  a[j1 + 1] = y0i - y2i;
  y0r = wk1i * x1r - wk1r * x1i;
  y0i = wk1i * x1i + wk1r * x1r;
  y2r = wk1r * x3r - wk1i * x3i;
  y2i = wk1r * x3i + wk1i * x3r;
  a[j2] = y0r - y2r;
  a[j2 + 1] = y0i - y2i;
  a[j3] = y0r + y2r;
  a[j3 + 1] = y0i + y2i;
}